

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanMemoryManager.cpp
# Opt level: O1

VulkanMemoryAllocation * __thiscall
VulkanUtilities::VulkanMemoryManager::Allocate
          (VulkanMemoryAllocation *__return_storage_ptr__,VulkanMemoryManager *this,
          VkDeviceSize Size,VkDeviceSize Alignment,uint32_t MemoryTypeIndex,bool HostVisible,
          VkMemoryAllocateFlags AllocateFlags)

{
  atomic<long> *paVar1;
  VkDeviceSize VVar2;
  _Alloc_hider _Var3;
  int iVar4;
  _Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
  _Var5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  char (*Args_1) [112];
  bool IsHostVisible;
  undefined4 in_register_00000084;
  char *Args_2;
  undefined7 in_register_00000089;
  uint uVar9;
  _Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>
  page_it;
  VulkanMemoryPage *this_00;
  pair<std::__detail::_Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>_>
  pVar10;
  MemorySizeFormatter<unsigned_long> *Args_9;
  uint32_t MemoryTypeIndex_local;
  _Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
  local_190;
  VkDeviceSize local_188;
  uint local_180;
  MemoryPageIndex PageIdx;
  ulong local_160;
  char local_158 [8];
  undefined8 local_150;
  string _msg;
  unsigned_long local_48;
  char local_40 [8];
  char local_38 [8];
  
  Args_2 = (char *)CONCAT44(in_register_00000084,MemoryTypeIndex);
  __return_storage_ptr__->Page = (VulkanMemoryPage *)0x0;
  __return_storage_ptr__->UnalignedOffset = 0;
  __return_storage_ptr__->Size = 0;
  PageIdx.AllocateFlags = AllocateFlags;
  MemoryTypeIndex_local = MemoryTypeIndex;
  local_188 = Alignment;
  PageIdx.MemoryTypeIndex = MemoryTypeIndex;
  PageIdx.IsHostVisible = HostVisible;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->m_PagesMtx);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  local_180 = (uint)CONCAT71(in_register_00000089,HostVisible);
  local_190._M_cur = (__node_type *)&this->m_Pages;
  pVar10 = std::
           _Hashtable<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_std::allocator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>_>,_std::__detail::_Select1st,_std::equal_to<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex>,_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
           ::equal_range((_Hashtable<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_std::allocator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>_>,_std::__detail::_Select1st,_std::equal_to<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex>,_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                          *)local_190._M_cur,&PageIdx);
  _Var5._M_cur = (__node_type *)
                 pVar10.first.
                 super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                 ._M_cur;
  if ((_Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
       )_Var5._M_cur !=
      pVar10.second.
      super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
      ._M_cur.
      super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
     ) {
    do {
      VulkanMemoryPage::Allocate
                ((VulkanMemoryAllocation *)&_msg,
                 (VulkanMemoryPage *)
                 ((long)&((_Var5._M_cur)->
                         super__Hash_node_value<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                         ).
                         super__Hash_node_value_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>_>
                         ._M_storage._M_storage + 0x10),Size,local_188);
      _Var3 = _msg._M_dataplus;
      __return_storage_ptr__->Page = (VulkanMemoryPage *)_msg._M_dataplus._M_p;
      __return_storage_ptr__->UnalignedOffset = _msg._M_string_length;
      __return_storage_ptr__->Size = _msg.field_2._M_allocated_capacity;
      _msg._M_dataplus._M_p = (pointer)0x0;
      _msg._M_string_length = 0;
      _msg.field_2._M_allocated_capacity = 0;
      VulkanMemoryAllocation::~VulkanMemoryAllocation((VulkanMemoryAllocation *)&_msg);
      if (_Var3._M_p != (pointer)0x0) break;
      _Var5._M_cur = (__node_type *)((_Var5._M_cur)->super__Hash_node_base)._M_nxt;
    } while ((_Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
              )_Var5._M_cur !=
             pVar10.second.
             super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
             ._M_cur.
             super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
            );
  }
  uVar9 = local_180 & 0xff;
  if (__return_storage_ptr__->Page == (VulkanMemoryPage *)0x0) {
    uVar8 = *(VkDeviceSize *)((long)(&this->m_CurrUsedSize + -2) + (ulong)uVar9 * 8);
    do {
      uVar6 = uVar8;
      uVar8 = uVar6 * 2;
    } while (uVar6 < Size);
    uVar7 = (this->m_CurrAllocatedSize)._M_elems[uVar9] + uVar6;
    (this->m_CurrAllocatedSize)._M_elems[uVar9] = uVar7;
    uVar8 = (this->m_PeakAllocatedSize)._M_elems[uVar9];
    if (uVar7 < uVar8) {
      uVar7 = uVar8;
    }
    (this->m_PeakAllocatedSize)._M_elems[uVar9] = uVar7;
    IsHostVisible = SUB41(local_180,0);
    VulkanMemoryPage::VulkanMemoryPage
              ((VulkanMemoryPage *)&_msg,this,uVar6,MemoryTypeIndex_local,IsHostVisible,
               AllocateFlags);
    local_190._M_cur =
         (__node_type *)
         std::
         _Hashtable<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,std::pair<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex_const,VulkanUtilities::VulkanMemoryPage>,std::allocator<std::pair<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex_const,VulkanUtilities::VulkanMemoryPage>>,std::__detail::_Select1st,std::equal_to<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex>,VulkanUtilities::VulkanMemoryManager::MemoryPageIndex::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
         ::
         _M_emplace<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex&,VulkanUtilities::VulkanMemoryPage>
                   (local_190._M_cur,0,&PageIdx,&_msg);
    Args_9 = (MemorySizeFormatter<unsigned_long> *)0x297e57;
    VulkanMemoryPage::~VulkanMemoryPage((VulkanMemoryPage *)&_msg);
    Args_2 = "device-local";
    if (IsHostVisible != false) {
      Args_2 = "host-visible";
    }
    local_158[0] = '\x02';
    local_158[1] = '\0';
    local_158[2] = '\0';
    local_158[3] = '\0';
    local_150 = 0;
    local_48 = (this->m_CurrAllocatedSize)._M_elems[uVar9];
    local_40[0] = '\x02';
    local_40[1] = '\0';
    local_40[2] = '\0';
    local_40[3] = '\0';
    local_38[0] = '\0';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    local_160 = uVar6;
    Diligent::
    FormatString<char[22],std::__cxx11::string,char[16],char[13],char[9],Diligent::MemorySizeFormatter<unsigned_long>,char[13],unsigned_int,char[28],Diligent::MemorySizeFormatter<unsigned_long>>
              (&_msg,(Diligent *)"VulkanMemoryManager \'",(char (*) [22])&this->m_MgrName,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "\': created new ",(char (*) [16])Args_2,(char (*) [13])" page. (",
               (char (*) [9])&local_160,(MemorySizeFormatter<unsigned_long> *)", type idx: ",
               (char (*) [13])&MemoryTypeIndex_local,(uint *)"). Current allocated size: ",
               (char (*) [28])&local_48,Args_9);
    _Var5._M_cur = local_190._M_cur;
    if (Diligent::DebugMessageCallback != (undefined *)0x0) {
      Args_2 = (char *)0x0;
      (*(code *)Diligent::DebugMessageCallback)(0,_msg._M_dataplus._M_p,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_msg._M_dataplus._M_p != &_msg.field_2) {
      operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
    }
    this_00 = (VulkanMemoryPage *)
              ((long)&((_Var5._M_cur)->
                      super__Hash_node_value<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                      ).
                      super__Hash_node_value_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>_>
                      ._M_storage._M_storage + 0x10);
    (**this->_vptr_VulkanMemoryManager)(this,this_00);
    VulkanMemoryPage::Allocate((VulkanMemoryAllocation *)&_msg,this_00,Size,local_188);
    _Var3 = _msg._M_dataplus;
    __return_storage_ptr__->Page = (VulkanMemoryPage *)_msg._M_dataplus._M_p;
    __return_storage_ptr__->UnalignedOffset = _msg._M_string_length;
    __return_storage_ptr__->Size = _msg.field_2._M_allocated_capacity;
    _msg._M_dataplus._M_p = (pointer)0x0;
    _msg._M_string_length = 0;
    _msg.field_2._M_allocated_capacity = 0;
    VulkanMemoryAllocation::~VulkanMemoryAllocation((VulkanMemoryAllocation *)&_msg);
    if (_Var3._M_p == (pointer)0x0) {
      Diligent::FormatString<char[35]>(&_msg,(char (*) [35])"Failed to allocate new memory page");
      Diligent::DebugAssertionFailed
                (_msg._M_dataplus._M_p,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
                 ,199);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_msg._M_dataplus._M_p != &_msg.field_2) {
        operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (__return_storage_ptr__->Page != (VulkanMemoryPage *)0x0) {
    VVar2 = __return_storage_ptr__->UnalignedOffset;
    local_160 = local_188;
    if ((local_188 ^ local_188 - 1) <= local_188 - 1) {
      Diligent::FormatString<char[12],unsigned_long,char[23]>
                (&_msg,(Diligent *)"Alignment (",(char (*) [12])&local_160,
                 (unsigned_long *)") must be a power of 2",(char (*) [23])Args_2);
      Diligent::DebugAssertionFailed
                (_msg._M_dataplus._M_p,"AlignUp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                 ,0x34);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_msg._M_dataplus._M_p != &_msg.field_2) {
        operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
      }
    }
    Args_1 = (char (*) [112])(VVar2 + local_160 + -1);
    if (__return_storage_ptr__->Size < (Size - VVar2) + (-local_160 & (ulong)Args_1)) {
      Diligent::FormatString<char[26],char[112]>
                (&_msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "Size + Diligent::AlignUp(Allocation.UnalignedOffset, Alignment) - Allocation.UnalignedOffset <= Allocation.Size"
                 ,Args_1);
      Diligent::DebugAssertionFailed
                (_msg._M_dataplus._M_p,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
                 ,0xcc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_msg._M_dataplus._M_p != &_msg.field_2) {
        operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
      }
    }
  }
  LOCK();
  paVar1 = (this->m_CurrUsedSize)._M_elems + uVar9;
  (paVar1->super___atomic_base<long>)._M_i =
       (paVar1->super___atomic_base<long>)._M_i + __return_storage_ptr__->Size;
  UNLOCK();
  uVar8 = (this->m_CurrUsedSize)._M_elems[uVar9].super___atomic_base<long>._M_i;
  uVar6 = (this->m_PeakUsedSize)._M_elems[uVar9];
  if (uVar8 < uVar6) {
    uVar8 = uVar6;
  }
  (this->m_PeakUsedSize)._M_elems[uVar9] = uVar8;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_PagesMtx);
  return __return_storage_ptr__;
}

Assistant:

VulkanMemoryAllocation VulkanMemoryManager::Allocate(VkDeviceSize Size, VkDeviceSize Alignment, uint32_t MemoryTypeIndex, bool HostVisible, VkMemoryAllocateFlags AllocateFlags)
{
    VulkanMemoryAllocation Allocation;

    // On integrated GPUs, there is no difference between host-visible and GPU-only
    // memory, so MemoryTypeIndex is the same. As GPU-only pages do not have CPU address,
    // we need to use HostVisible flag to differentiate the two.
    // It is likely a good idea to always keep staging pages separate to reduce fragmentation
    // even though on integrated GPUs same pages can be used for both GPU-only and staging
    // allocations. Staging allocations are short-living and will be released when upload is
    // complete, while GPU-only allocations are expected to be long-living.
    MemoryPageIndex             PageIdx{MemoryTypeIndex, HostVisible, AllocateFlags};
    std::lock_guard<std::mutex> Lock{m_PagesMtx};

    auto range = m_Pages.equal_range(PageIdx);
    for (auto page_it = range.first; page_it != range.second; ++page_it)
    {
        Allocation = page_it->second.Allocate(Size, Alignment);
        if (Allocation.Page != nullptr)
            break;
    }

    size_t stat_ind = HostVisible ? 1 : 0;
    if (Allocation.Page == nullptr)
    {
        auto PageSize = HostVisible ? m_HostVisiblePageSize : m_DeviceLocalPageSize;
        while (PageSize < Size)
            PageSize *= 2;

        m_CurrAllocatedSize[stat_ind] += PageSize;
        m_PeakAllocatedSize[stat_ind] = std::max(m_PeakAllocatedSize[stat_ind], m_CurrAllocatedSize[stat_ind]);

        auto it = m_Pages.emplace(PageIdx, VulkanMemoryPage{*this, PageSize, MemoryTypeIndex, HostVisible, AllocateFlags});
        LOG_INFO_MESSAGE("VulkanMemoryManager '", m_MgrName, "': created new ", (HostVisible ? "host-visible" : "device-local"),
                         " page. (", Diligent::FormatMemorySize(PageSize, 2), ", type idx: ", MemoryTypeIndex,
                         "). Current allocated size: ", Diligent::FormatMemorySize(m_CurrAllocatedSize[stat_ind], 2));
        OnNewPageCreated(it->second);
        Allocation = it->second.Allocate(Size, Alignment);
        DEV_CHECK_ERR(Allocation.Page != nullptr, "Failed to allocate new memory page");
    }

    if (Allocation.Page != nullptr)
    {
        VERIFY_EXPR(Size + Diligent::AlignUp(Allocation.UnalignedOffset, Alignment) - Allocation.UnalignedOffset <= Allocation.Size);
    }

    m_CurrUsedSize[stat_ind].fetch_add(Allocation.Size);
    m_PeakUsedSize[stat_ind] = std::max(m_PeakUsedSize[stat_ind], static_cast<VkDeviceSize>(m_CurrUsedSize[stat_ind].load()));

    return Allocation;
}